

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O1

void __thiscall Date::Date(Date *this,uint32_t year,Month month,uint32_t day)

{
  uint uVar1;
  char cVar2;
  bool bVar3;
  char cVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  long *plVar8;
  undefined8 *puVar9;
  undefined8 extraout_RAX;
  int iVar10;
  uint uVar11;
  long lVar12;
  long *plVar13;
  ulong *puVar14;
  size_type *psVar15;
  uint32_t uVar16;
  int *piVar17;
  Month __val;
  ulong uVar18;
  long lVar19;
  string __str_1;
  string __str_2;
  string __str;
  ulong *local_150;
  long local_148;
  ulong local_140;
  long lStack_138;
  ulong *local_130;
  long local_128;
  ulong local_120 [2];
  ulong *local_110;
  uint local_108;
  undefined4 uStack_104;
  ulong local_100 [2];
  long *local_f0;
  undefined8 local_e8;
  long local_e0;
  undefined8 uStack_d8;
  long *local_d0;
  undefined8 local_c8;
  long local_c0;
  undefined8 uStack_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  long *local_50;
  uint local_48;
  long local_40 [2];
  
  this->days = 0;
  bVar3 = is_date(year,month,day);
  if (bVar3) {
    if (year == 0x7b2) {
      lVar19 = 0;
    }
    else {
      uVar6 = 0x7b2;
      iVar10 = -0x7b2;
      lVar19 = 0;
      do {
        lVar12 = 0x16d;
        if (((uVar6 & 3) == 0) && (lVar12 = 0x16e, (int)(uVar6 / 100) * 100 + iVar10 == 0)) {
          lVar12 = (ulong)((int)(uVar6 / 400) * 400 + iVar10 == 0) + 0x16d;
        }
        lVar19 = lVar19 + lVar12;
        uVar5 = (int)uVar6 + 1;
        uVar6 = (ulong)uVar5;
        iVar10 = iVar10 + -1;
      } while (year != uVar5);
    }
    days_in_months(year);
    lVar12 = (long)(int)month + -1;
    if (lVar12 == 0) {
      lVar7 = 0;
    }
    else {
      piVar17 = days_in_months::days_in_months;
      lVar7 = 0;
      do {
        lVar7 = lVar7 + *piVar17;
        piVar17 = piVar17 + 1;
        lVar12 = lVar12 + -1;
      } while (lVar12 != 0);
    }
    this->days = this->days + (ulong)day + lVar19 + lVar7 + -1;
    return;
  }
  cVar4 = '\x01';
  if (9 < year) {
    uVar5 = year;
    cVar2 = '\x04';
    do {
      cVar4 = cVar2;
      if (uVar5 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_00112660;
      }
      if (uVar5 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_00112660;
      }
      if (uVar5 < 10000) goto LAB_00112660;
      bVar3 = 99999 < uVar5;
      uVar5 = uVar5 / 10000;
      cVar2 = cVar4 + '\x04';
    } while (bVar3);
    cVar4 = cVar4 + '\x01';
  }
LAB_00112660:
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_50,local_48,year);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x116f90);
  local_90 = (long *)*plVar8;
  plVar13 = plVar8 + 2;
  if (local_90 == plVar13) {
    local_80 = *plVar13;
    lStack_78 = plVar8[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar13;
  }
  local_88 = plVar8[1];
  *plVar8 = (long)plVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_150 = (ulong *)*plVar8;
  puVar14 = (ulong *)(plVar8 + 2);
  if (local_150 == puVar14) {
    local_140 = *puVar14;
    lStack_138 = plVar8[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar14;
  }
  local_148 = plVar8[1];
  *plVar8 = (long)puVar14;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  __val = -month;
  if (0 < (int)month) {
    __val = month;
  }
  uVar5 = 1;
  if (sep < __val) {
    uVar6 = (ulong)__val;
    uVar1 = 4;
    do {
      uVar5 = uVar1;
      uVar11 = (uint)uVar6;
      if (uVar11 < 100) {
        uVar5 = uVar5 - 2;
        goto LAB_001127b2;
      }
      if (uVar11 < 1000) {
        uVar5 = uVar5 - 1;
        goto LAB_001127b2;
      }
      if (uVar11 < 10000) goto LAB_001127b2;
      uVar6 = uVar6 / 10000;
      uVar1 = uVar5 + 4;
    } while (99999 < uVar11);
    uVar5 = uVar5 + 1;
  }
LAB_001127b2:
  local_130 = local_120;
  std::__cxx11::string::_M_construct((ulong)&local_130,(char)uVar5 - (char)((int)month >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(month >> 0x1f) + (long)local_130),uVar5,__val);
  uVar6 = 0xf;
  if (local_150 != &local_140) {
    uVar6 = local_140;
  }
  if (uVar6 < (ulong)(local_128 + local_148)) {
    uVar6 = 0xf;
    if (local_130 != local_120) {
      uVar6 = local_120[0];
    }
    if (uVar6 < (ulong)(local_128 + local_148)) goto LAB_0011282b;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_0011282b:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_130);
  }
  local_f0 = (long *)*puVar9;
  plVar8 = puVar9 + 2;
  if (local_f0 == plVar8) {
    local_e0 = *plVar8;
    uStack_d8 = puVar9[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *plVar8;
  }
  local_e8 = puVar9[1];
  *puVar9 = plVar8;
  puVar9[1] = 0;
  *(undefined1 *)plVar8 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_f0);
  local_b0 = (ulong *)*plVar8;
  puVar14 = (ulong *)(plVar8 + 2);
  if (local_b0 == puVar14) {
    local_a0 = *puVar14;
    lStack_98 = plVar8[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *puVar14;
  }
  local_a8 = plVar8[1];
  *plVar8 = (long)puVar14;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  cVar4 = '\x01';
  if (9 < day) {
    uVar16 = day;
    cVar2 = '\x04';
    do {
      cVar4 = cVar2;
      if (uVar16 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_00112942;
      }
      if (uVar16 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_00112942;
      }
      if (uVar16 < 10000) goto LAB_00112942;
      bVar3 = 99999 < uVar16;
      uVar16 = uVar16 / 10000;
      cVar2 = cVar4 + '\x04';
    } while (bVar3);
    cVar4 = cVar4 + '\x01';
  }
LAB_00112942:
  local_110 = local_100;
  std::__cxx11::string::_M_construct((ulong)&local_110,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_110,local_108,day);
  uVar6 = CONCAT44(uStack_104,local_108) + local_a8;
  uVar18 = 0xf;
  if (local_b0 != &local_a0) {
    uVar18 = local_a0;
  }
  if (uVar18 < uVar6) {
    uVar18 = 0xf;
    if (local_110 != local_100) {
      uVar18 = local_100[0];
    }
    if (uVar6 <= uVar18) {
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_b0);
      goto LAB_001129d1;
    }
  }
  puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_110);
LAB_001129d1:
  local_d0 = (long *)*puVar9;
  plVar8 = puVar9 + 2;
  if (local_d0 == plVar8) {
    local_c0 = *plVar8;
    uStack_b8 = puVar9[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar8;
  }
  local_c8 = puVar9[1];
  *puVar9 = plVar8;
  puVar9[1] = 0;
  *(undefined1 *)plVar8 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_d0);
  local_70._M_dataplus._M_p = (pointer)*plVar8;
  psVar15 = (size_type *)(plVar8 + 2);
  if ((size_type *)local_70._M_dataplus._M_p == psVar15) {
    local_70.field_2._M_allocated_capacity = *psVar15;
    local_70.field_2._8_8_ = plVar8[3];
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar15;
  }
  local_70._M_string_length = plVar8[1];
  *plVar8 = (long)psVar15;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  error(&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_110 != local_100) {
    operator_delete(local_110,local_100[0] + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_130 != local_120) {
    operator_delete(local_130,local_120[0] + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

Date::Date(uint32_t year, Month month, uint32_t day) : days{0}
{
	if (!is_date(year, month, day))
	{
		error("Error in Date::Date() - (" + std::to_string(year)
			+ ","
			+ std::to_string(int(month)) 
			+ ","
			+ std::to_string(day)
			+ ") is not a valid date."
		);
	}
	days += days_untill_year(year) + days_untill_month(month, year) + day - 1;
}